

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testMethod_find_last_not_of(void)

{
  string_view *this;
  element_type *peVar1;
  ostream *poVar2;
  size_type sVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  string_view sVar8;
  String str;
  undefined1 local_58 [32];
  String local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_find_last_not_of()\n",0x1e);
  cm::String::String<char_const(&)[7],void>(&local_38,(char (*) [7])"abcabc");
  if (local_38.view_._M_len != 0) {
    this = &local_38.view_;
    sVar4 = local_38.view_._M_len;
    do {
      if ((local_38.view_._M_str[sVar4 - 1] != 'a') && (local_38.view_._M_str[sVar4 - 1] != '_')) {
        if (sVar4 == 6) {
          uVar5 = (ulong)(local_38.view_._M_len != 1);
          goto LAB_001c8341;
        }
        break;
      }
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  iVar6 = 0x3fe;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ASSERT_TRUE(str.find_last_not_of(\"_a\") == 5) failed on line ",
             0x3c);
  goto LAB_001c8377;
  while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
LAB_001c8341:
    if ((local_38.view_._M_str[uVar5] != 'a') && (local_38.view_._M_str[uVar5] != '_')) {
      if (uVar5 == 1) {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,"_a",0xffffffffffffffff,2);
        if (sVar3 == 5) {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (this,"_a",1,2);
          sVar4 = local_38.view_._M_len;
          if (sVar3 == 1) goto joined_r0x001c8404;
          iVar6 = 0x403;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(a, 1) == 1) failed on line ",0x3c);
        }
        else {
          iVar6 = 0x402;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(a) == 5) failed on line ",0x39);
        }
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        goto LAB_001c8399;
      }
      break;
    }
  }
  iVar6 = 0x3ff;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "ASSERT_TRUE(str.find_last_not_of(\"_a\", 1) == 1) failed on line ",0x3f);
  goto LAB_001c8377;
joined_r0x001c8404:
  if (sVar4 == 0) goto LAB_001c84cc;
  if (local_38.view_._M_str[sVar4 - 1] != 'a') {
    if (sVar4 == 6) {
      uVar5 = (ulong)(local_38.view_._M_len != 1);
      goto LAB_001c84bb;
    }
    goto LAB_001c84cc;
  }
  sVar4 = sVar4 - 1;
  goto joined_r0x001c8404;
LAB_001c84cc:
  iVar6 = 0x405;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ASSERT_TRUE(str.find_last_not_of(\'a\') == 5) failed on line ",
             0x3b);
  goto LAB_001c8377;
  while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
LAB_001c84bb:
    if (local_38.view_._M_str[uVar5] != 'a') {
      if (uVar5 == 1) {
        peVar1 = (element_type *)(local_58 + 0x10);
        local_58._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"_a","");
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,(char *)local_58._0_8_,0xffffffffffffffff,local_58._8_8_);
        if ((element_type *)local_58._0_8_ != peVar1) {
          operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
        }
        if (sVar3 != 5) {
          iVar6 = 0x407;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(std::string(\"_a\")) == 5) failed on line ",
                     0x49);
          goto LAB_001c8377;
        }
        local_58._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"_a","");
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,(char *)local_58._0_8_,1,local_58._8_8_);
        if ((element_type *)local_58._0_8_ != peVar1) {
          operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
        }
        if (sVar3 != 1) {
          iVar6 = 0x408;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(std::string(\"_a\"), 1) == 1) failed on line "
                     ,0x4c);
          goto LAB_001c8377;
        }
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,"cb_",0xffffffffffffffff,1);
        if (sVar3 != 4) {
          iVar6 = 0x409;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(cm::string_view(\"cb_\", 1)) == 4) failed on line "
                     ,0x51);
          goto LAB_001c8377;
        }
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,"cb_",2,1);
        if (sVar3 != 1) {
          iVar6 = 0x40a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(cm::string_view(\"cb_\", 1), 2) == 1) failed on line "
                     ,0x54);
          goto LAB_001c8377;
        }
        cm::String::String<char_const(&)[3],void>((String *)local_58,(char (*) [3])"_a");
        sVar8 = cm::AsStringView<cm::String>::view((String *)local_58);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,sVar8._M_str,0xffffffffffffffff,sVar8._M_len);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        if (sVar3 != 5) {
          iVar6 = 0x40b;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(cm::String(\"_a\")) == 5) failed on line ",
                     0x48);
          goto LAB_001c8377;
        }
        cm::String::String<char_const(&)[3],void>((String *)local_58,(char (*) [3])"_a");
        sVar8 = cm::AsStringView<cm::String>::view((String *)local_58);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,sVar8._M_str,1,sVar8._M_len);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        if (sVar3 != 1) {
          iVar6 = 0x40c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(str.find_last_not_of(cm::String(\"_a\"), 1) == 1) failed on line "
                     ,0x4b);
          goto LAB_001c8377;
        }
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                          (this,"cb_",2,2);
        if (sVar3 == 0) {
          bVar7 = true;
          goto LAB_001c839b;
        }
        iVar6 = 0x40d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(str.find_last_not_of(\"cb_\", 2, 2) == 0) failed on line ",0x43);
        goto LAB_001c8377;
      }
      break;
    }
  }
  iVar6 = 0x406;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "ASSERT_TRUE(str.find_last_not_of(\'a\', 1) == 1) failed on line ",0x3e);
LAB_001c8377:
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
LAB_001c8399:
  bVar7 = false;
LAB_001c839b:
  if (local_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar7;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}